

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManCleanTruth(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  
  p_00 = p->vTruths;
  if (p_00 == (Vec_Int_t *)0x0) {
    p_00 = Vec_IntAlloc(p->nObjs);
    p->vTruths = p_00;
  }
  Vec_IntFill(p_00,p->nObjs,-1);
  return;
}

Assistant:

void Gia_ManCleanTruth( Gia_Man_t * p )
{
    if ( p->vTruths == NULL )
        p->vTruths = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_IntFill( p->vTruths, Gia_ManObjNum(p), -1 );
}